

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O3

vecIdxTy * __thiscall
Apt::ShortestPath(vecIdxTy *__return_storage_ptr__,Apt *this,size_t _startN,size_t _endN,
                 double _maxLen,double _headingAtStart,double _headingAtEnd)

{
  pointer pTVar1;
  pointer pTVar2;
  unsigned_long uVar3;
  pointer puVar4;
  ulong uVar5;
  size_t sVar6;
  pointer pTVar7;
  LTError *this_00;
  pointer puVar8;
  pointer pTVar9;
  pointer puVar10;
  unsigned_long idxB;
  bool bVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  size_t updNIdx;
  size_t local_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  size_t local_88;
  double local_80;
  vecIdxTy *local_78;
  double local_70;
  double local_68;
  size_t *local_60;
  double local_58;
  double local_50;
  double local_48;
  pointer local_40;
  size_t local_38;
  
  if (_startN == _endN) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pTVar9 = pTVar7; pTVar9 != pTVar1; pTVar9 = pTVar9 + 1) {
      pTVar9->pathLen = INFINITY;
      pTVar9->prevIdx = 0xffffffffffffffff;
      pTVar9->bVisited = false;
    }
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar5 = (long)pTVar1 - (long)pTVar7 >> 6;
    local_88 = _endN;
    local_70 = _headingAtStart;
    local_68 = _headingAtEnd;
    local_58 = _maxLen;
    local_38 = _startN;
    if (uVar5 <= _startN) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",_startN
                 ,uVar5);
    }
    if (uVar5 <= _endN) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",_endN,
                 uVar5);
    }
    pTVar7[_startN].pathLen = 0.0;
    pTVar7[_startN].prevIdx = 0xfffffffffffffffe;
    local_78 = __return_storage_ptr__;
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,(iterator)0x0,
               &local_38);
    bVar11 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar12 = pTVar7[local_88].prevIdx == 0xffffffffffffffff;
    if (bVar11 && bVar12) {
      local_60 = &pTVar7[local_88].prevIdx;
      do {
        idxB = *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
        pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_50 = pTVar7[idxB].pathLen;
        puVar8 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
        puVar10 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
        dVar14 = local_50;
        if (puVar8 != local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_50 = pTVar7[*puVar8].pathLen;
            puVar4 = puVar8;
            if (dVar14 <= local_50) {
              local_50 = dVar14;
              puVar4 = puVar10;
            }
            puVar10 = puVar4;
            puVar8 = puVar8 + 1;
            dVar14 = local_50;
          } while (puVar8 != local_a8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          idxB = *puVar10;
        }
        local_80 = local_70;
        if (pTVar7[idxB].prevIdx < 0xfffffffffffffffe) {
          sVar6 = GetEdgeBetweenNodes(this,pTVar7[idxB].prevIdx,idxB);
          local_80 = local_70;
          if (sVar6 != 0xffffffffffffffff) {
            pTVar2 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_80 = pTVar2[sVar6].angle;
            if (pTVar2[sVar6].a != pTVar7[idxB].prevIdx) {
              local_80 = local_80 + 180.0;
            }
          }
        }
        pTVar7[idxB].bVisited = true;
        puVar8 = puVar10 + 1;
        if (puVar8 != local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          memmove(puVar10,puVar8,
                  (long)local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar8);
        }
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
        puVar8 = pTVar7[idxB].vecEdges.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar10 = *(pointer *)
                   ((long)&pTVar7[idxB].vecEdges.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   + 8);
        local_40 = puVar10;
        if (puVar8 != puVar10) {
          do {
            uVar3 = *puVar8;
            pTVar2 = (this->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pTVar2[uVar3].type - RUN_WAY < 2) {
              sVar6 = pTVar2[uVar3].a;
              if (sVar6 == idxB) {
                sVar6 = pTVar2[uVar3].b;
              }
              pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              puVar10 = local_40;
              local_b0 = sVar6;
              if (pTVar7[sVar6].bVisited == false) {
                dVar14 = pTVar2[uVar3].angle;
                if (pTVar2[uVar3].a != idxB) {
                  dVar14 = pTVar2[uVar3].angle + 180.0;
                }
                if (((((NAN(local_80)) ||
                      (local_48 = dVar14, dVar13 = HeadingDiff(local_80,dVar14), puVar10 = local_40,
                      dVar14 = local_48, ABS(dVar13) <= 100.0)) &&
                     ((NAN(local_68) ||
                      ((local_b0 != local_88 ||
                       (dVar14 = HeadingDiff(local_68,dVar14), puVar10 = local_40,
                       ABS(dVar14) <= 100.0)))))) &&
                    (dVar14 = pTVar2[uVar3].dist_m + local_50, puVar10 = local_40,
                    dVar14 <= local_58)) && (dVar14 < pTVar7[sVar6].pathLen)) {
                  pTVar7[sVar6].pathLen = dVar14;
                  pTVar7[sVar6].prevIdx = idxB;
                  if (local_b0 == local_88) break;
                  push_back_unique<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                            (&local_a8,&local_b0);
                  puVar10 = local_40;
                }
              }
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
        bVar12 = *local_60 == 0xffffffffffffffff;
        bVar11 = local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      } while ((bVar11) && (*local_60 == 0xffffffffffffffff));
    }
    __return_storage_ptr__ = local_78;
    if (bVar12) {
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      if (bVar11) {
        local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      if (local_88 < 0xfffffffffffffffe) {
        pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_b0 = local_88;
        do {
          if ((ulong)((long)(this->vecTaxiNodes).
                            super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pTVar7 >> 6) <= local_b0) {
            this_00 = (LTError *)__cxa_allocate_exception(0x18);
            LTError::LTError(this_00,
                             "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                             ,0x49e,"ShortestPath",logFATAL,"ASSERT FAILED: %s",
                             "nIdx < vecTaxiNodes.size()");
            __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
          }
          if (local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_a8,
                       (iterator)
                       local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_b0);
            pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            *local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = local_b0;
            local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_b0 = pTVar7[local_b0].prevIdx;
        } while (local_b0 < 0xfffffffffffffffe);
      }
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      __return_storage_ptr__ = local_78;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vecIdxTy ShortestPath (size_t _startN, size_t _endN, double _maxLen,
                           double _headingAtStart,
                           double _headingAtEnd)
    {
        // Sanity check: _start and _end should differ
        if (_startN == _endN)
            return vecIdxTy();


        // Initialize the Dijkstra values in the nodes array
        for (TaxiNode& n: vecTaxiNodes)
            n.InitDijkstraAttr();

        // This array stores nodes we need to visit
        // (have an initial distance, but aren't fully visited yet)
        vecIdxTy vecVisit;

        // The start place is the given taxiway node
        TaxiNode& startN = vecTaxiNodes.at(_startN);
        const TaxiNode& endN   = vecTaxiNodes.at(_endN);
        startN.pathLen = 0.0;
        startN.prevIdx = ULONG_MAX-1;   // we use "ULONG_MAX-1" for saying "is a start node"
        vecVisit.push_back(_startN);

        // General heading between start and end (reversed)
        // defines first heading (how we leave _startN) and
        // how far the plane is allowed to turn
        
        // outer loop controls currently visited node and checks if end already found
        while (!vecVisit.empty() && endN.prevIdx == ULONG_MAX)
        {
            // fetch node with shortest yet known distance
            // (this isn't awfully efficient, but keeping a separate map or prio-queue
            //  sorted while updating nodes in the next loop
            //  is not simple either. I expect vecVisit to stay short
            //  due to cut-off at _maxLen, so I've decided this way:)
            vecIdxTy::iterator shortestIter = vecVisit.begin();
            double shortestDist = vecTaxiNodes[*shortestIter].pathLen;
            for (vecIdxTy::iterator i = std::next(shortestIter);
                 i != vecVisit.end(); ++i)
            {
                if (vecTaxiNodes[*i].pathLen < shortestDist) {
                    shortestIter = i;
                    shortestDist = vecTaxiNodes[*i].pathLen;
                }
            }
            const size_t shortestNIdx  = *shortestIter;
            TaxiNode& shortestN = vecTaxiNodes[shortestNIdx];
            
            // To avoid too sharp corners we need to know the angle by which we reach this shortest node
            const size_t idxEdgeToShortestN =
            shortestN.prevIdx >= ULONG_MAX-1 ? EDGE_UNKNOWN :
            GetEdgeBetweenNodes(shortestN.prevIdx, shortestNIdx);
            // start heading for when leaving first node, otherwise heading between previous and current node
            const double angleToShortestN =
            idxEdgeToShortestN == EDGE_UNKNOWN ? _headingAtStart :
            vecTaxiEdges[idxEdgeToShortestN].GetAngleFrom(shortestN.prevIdx);
            
            // This one is now already counted as "visited" so no more updates to its pathLen!
            shortestN.bVisited = true;
            vecVisit.erase(shortestIter);

            // Update all connected nodes with best possible distance
            for (size_t eIdx: shortestN.vecEdges)
            {
                const TaxiEdge& e = vecTaxiEdges[eIdx];
                if (!e.isValid()) continue;
                
                size_t updNIdx    = e.otherNode(shortestNIdx);
                TaxiNode& updN    = vecTaxiNodes[updNIdx];
                
                // if aleady visited then no need to re-assess
                if (updN.bVisited)
                    continue;
                
                // Don't allow turns of more than 100°,
                // ie. edge not valid if it would turn more than that
                const double eAngle = e.GetAngleFrom(shortestNIdx);
                if (!std::isnan(angleToShortestN) &&
                    std::abs(HeadingDiff(angleToShortestN,
                                         eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // If the node being analyzed is the end node, then we also
                // need to verify if the heading from end node to actual a/c position
                // would not again cause too sharp a turn:
                if (updNIdx == _endN && !std::isnan(_headingAtEnd) &&
                    std::abs(HeadingDiff(_headingAtEnd, eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // Calculate the yet known best distance to this node
                const double lenToUpd = shortestDist + e.dist_m;
                if (lenToUpd > _maxLen ||               // too far out?
                    updN.pathLen <= lenToUpd)           // node has a faster path already
                    continue;

                // Update this node with new best values
                updN.pathLen = lenToUpd;        // best new known distance
                updN.prevIdx = shortestNIdx;     // predecessor to achieve that distance
                
                // Have we reached the wanted end node?
                if (updNIdx == _endN)
                    break;
                
                // this node is now ready to be visited
                push_back_unique(vecVisit, updNIdx);
            }
        }
        
        // Found nothing? -> return empty list
        if (endN.prevIdx == ULONG_MAX)
            return vecIdxTy();
        
        // put together the nodes from _start through _end in the right order
        vecVisit.clear();
        for (size_t nIdx = _endN;
             nIdx < ULONG_MAX-1;                    // until nIdx becomes invalid
             nIdx = vecTaxiNodes[nIdx].prevIdx)     // move on to _previous_ node on shortest path
        {
            LOG_ASSERT(nIdx < vecTaxiNodes.size());
            vecVisit.push_back(nIdx);
        }
        return vecVisit;
    }